

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void ats_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  byte bVar1;
  _Bool _Var2;
  int iVar3;
  uint64_t uVar4;
  ARMMMUIdx AStack_34;
  _Bool secure;
  int el;
  ARMMMUIdx mmu_idx;
  uint64_t par64;
  MMUAccessType access_type;
  uint64_t value_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  bVar1 = ri->opc2;
  iVar3 = arm_current_el(env);
  _Var2 = arm_is_secure_below_el3(env);
  switch(ri->opc2 & 6) {
  case 0:
    if (iVar3 != 1) {
      if (iVar3 != 2) {
        if (iVar3 != 3) {
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                     ,0xc58,(char *)0x0);
        }
        AStack_34 = ARMMMUIdx_SE3;
        break;
      }
      if (_Var2) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                   ,0xc4d,"!secure");
      }
    }
    if ((ri->crm == '\t') && ((env->uncached_cpsr & 0x400000) != 0)) {
      AStack_34 = ARMMMUIdx_Stage1_E1_PAN;
      if (_Var2) {
        AStack_34 = ARMMMUIdx_SE10_1_PAN;
      }
    }
    else {
      AStack_34 = ARMMMUIdx_Stage1_E1;
      if (_Var2) {
        AStack_34 = ARMMMUIdx_SE10_1;
      }
    }
    break;
  case 2:
    if (iVar3 == 1) {
      AStack_34 = ARMMMUIdx_Stage1_E0;
      if (_Var2) {
        AStack_34 = ARMMMUIdx_SE10_0;
      }
    }
    else if (iVar3 == 2) {
      AStack_34 = ARMMMUIdx_Stage1_E0;
    }
    else {
      if (iVar3 != 3) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                   ,0xc69,(char *)0x0);
      }
      AStack_34 = ARMMMUIdx_SE10_0;
    }
    break;
  case 4:
    AStack_34 = ARMMMUIdx_E10_1;
    break;
  case 6:
    AStack_34 = ARMMMUIdx_E10_0;
    break;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
               ,0xc76,(char *)0x0);
  }
  uVar4 = do_ats_write(env,value,bVar1 & MMU_DATA_STORE,AStack_34);
  _Var2 = arm_is_secure(env);
  if ((!_Var2) || (_Var2 = arm_el_is_aa64(env,3), _Var2)) {
    (env->cp15).field_26.field_0.par_ns = uVar4;
  }
  else {
    (env->cp15).field_26.field_0.par_s = uVar4;
  }
  return;
}

Assistant:

static void ats_write(CPUARMState *env, const ARMCPRegInfo *ri, uint64_t value)
{
    MMUAccessType access_type = ri->opc2 & 1 ? MMU_DATA_STORE : MMU_DATA_LOAD;
    uint64_t par64;
    ARMMMUIdx mmu_idx = 0;
    int el = arm_current_el(env);
    bool secure = arm_is_secure_below_el3(env);

    switch (ri->opc2 & 6) {
    case 0:
        /* stage 1 current state PL1: ATS1CPR, ATS1CPW, ATS1CPRP, ATS1CPWP */
        switch (el) {
        case 3:
            mmu_idx = ARMMMUIdx_SE3;
            break;
        case 2:
            g_assert(!secure);  /* TODO: ARMv8.4-SecEL2 */
            /* fall through */
        case 1:
            if (ri->crm == 9 && (env->uncached_cpsr & CPSR_PAN)) {
                mmu_idx = (secure ? ARMMMUIdx_SE10_1_PAN
                           : ARMMMUIdx_Stage1_E1_PAN);
            } else {
                mmu_idx = secure ? ARMMMUIdx_SE10_1 : ARMMMUIdx_Stage1_E1;
            }
            break;
        default:
            g_assert_not_reached();
            break;
        }
        break;
    case 2:
        /* stage 1 current state PL0: ATS1CUR, ATS1CUW */
        switch (el) {
        case 3:
            mmu_idx = ARMMMUIdx_SE10_0;
            break;
        case 2:
            mmu_idx = ARMMMUIdx_Stage1_E0;
            break;
        case 1:
            mmu_idx = secure ? ARMMMUIdx_SE10_0 : ARMMMUIdx_Stage1_E0;
            break;
        default:
            g_assert_not_reached();
            break;
        }
        break;
    case 4:
        /* stage 1+2 NonSecure PL1: ATS12NSOPR, ATS12NSOPW */
        mmu_idx = ARMMMUIdx_E10_1;
        break;
    case 6:
        /* stage 1+2 NonSecure PL0: ATS12NSOUR, ATS12NSOUW */
        mmu_idx = ARMMMUIdx_E10_0;
        break;
    default:
        g_assert_not_reached();
        break;
    }

    par64 = do_ats_write(env, value, access_type, mmu_idx);

    A32_BANKED_CURRENT_REG_SET(env, par, par64);
}